

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_fullscreen.cxx
# Opt level: O3

void __thiscall Fl_Window::fullscreen_screens(Fl_Window *this,int top,int bottom,int left,int right)

{
  byte *pbVar1;
  int iVar2;
  Window WVar3;
  bool bVar4;
  
  bVar4 = (bottom | top | left | right) < 0;
  if (bVar4) {
    top = -1;
    bottom = -1;
  }
  if (bVar4) {
    left = -1;
    right = -1;
  }
  fullscreen_screen_top = top;
  fullscreen_screen_bottom = bottom;
  fullscreen_screen_left = left;
  fullscreen_screen_right = right;
  if ((this->i != (Fl_X *)0x0) && (((this->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0))
  {
    iVar2 = Fl_X::ewmh_supported();
    if (iVar2 == 0) {
      pbVar1 = (byte *)((long)&(this->super_Fl_Group).super_Fl_Widget.flags_ + 2);
      *pbVar1 = *pbVar1 | 4;
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])(this);
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
      if (this->i == (Fl_X *)0x0) {
        WVar3 = 0;
      }
      else {
        WVar3 = this->i->xid;
      }
      XGrabKeyboard(fl_display,WVar3,1,1,1,fl_event_time);
      Fl::handle(0x19,this);
      return;
    }
    if ((fullscreen_screen_top | fullscreen_screen_bottom | fullscreen_screen_left |
        fullscreen_screen_right) < 0) {
      Fl::screen_num((this->super_Fl_Group).super_Fl_Widget.x_,
                     (this->super_Fl_Group).super_Fl_Widget.y_,
                     (this->super_Fl_Group).super_Fl_Widget.w_,
                     (this->super_Fl_Group).super_Fl_Widget.h_);
    }
    WVar3 = 0;
    XSendEvent(fl_display,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + 0x10 + (long)fl_screen * 0x80),0,
               0x180000);
    if (this->i != (Fl_X *)0x0) {
      WVar3 = this->i->xid;
    }
    send_wm_state_event(WVar3,1,fl_NET_WM_STATE_FULLSCREEN);
    return;
  }
  return;
}

Assistant:

void Fl_Window::fullscreen_screens(int top, int bottom, int left, int right) {
  if ((top < 0) || (bottom < 0) || (left < 0) || (right < 0)) {
    fullscreen_screen_top = -1;
    fullscreen_screen_bottom = -1;
    fullscreen_screen_left = -1;
    fullscreen_screen_right = -1;
  } else {
    fullscreen_screen_top = top;
    fullscreen_screen_bottom = bottom;
    fullscreen_screen_left = left;
    fullscreen_screen_right = right;
  }

  if (shown() && fullscreen_active())
    fullscreen_x();
}